

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::create_torrent::set_hash(create_torrent *this,piece_index_t index,sha1_hash *h)

{
  undefined8 uVar1;
  pointer pdVar2;
  error_code_enum local_1c;
  
  if ((this->field_0x258 & 0x10) == 0) {
    pdVar2 = (this->m_piece_hash).
             super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
             super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pdVar2 == (this->m_piece_hash).
                  super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                  .
                  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
      resize(&(this->m_piece_hash).
              super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
             ,(long)this->m_num_pieces);
      pdVar2 = (this->m_piece_hash).
               super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
               .
               super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    pdVar2[index.m_val].m_number._M_elems[4] = (h->m_number)._M_elems[4];
    uVar1 = *(undefined8 *)((h->m_number)._M_elems + 2);
    *(undefined8 *)pdVar2[index.m_val].m_number._M_elems = *(undefined8 *)(h->m_number)._M_elems;
    *(undefined8 *)(pdVar2[index.m_val].m_number._M_elems + 2) = uVar1;
    return;
  }
  local_1c = invalid_hash_entry;
  aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>(&local_1c);
}

Assistant:

void create_torrent::set_hash(piece_index_t index, sha1_hash const& h)
	{
		if (m_v2_only)
			aux::throw_ex<system_error>(errors::invalid_hash_entry);

		if (m_piece_hash.empty())
			m_piece_hash.resize(m_num_pieces);

		TORRENT_ASSERT_PRECOND(index >= piece_index_t(0));
		TORRENT_ASSERT_PRECOND(index < m_piece_hash.end_index());
		m_piece_hash[index] = h;
	}